

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

void __thiscall
QGraphicsProxyWidget::paint
          (QGraphicsProxyWidget *this,QPainter *painter,QStyleOptionGraphicsItem *option,
          QWidget *widget)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  long *plVar4;
  QRect *pQVar5;
  QWidget *pQVar6;
  QPoint targetOffset;
  long in_RDX;
  QRect *in_RSI;
  long in_FS_OFFSET;
  QGraphicsProxyWidgetPrivate *d;
  QRect exposedWidgetRect;
  undefined4 in_stack_ffffffffffffff28;
  GraphicsItemFlag in_stack_ffffffffffffff2c;
  QRect *in_stack_ffffffffffffff30;
  QFlag QVar7;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  QFlag local_78 [2];
  QRegion in_stack_ffffffffffffff90;
  QFlagsStorage<QGraphicsItem::GraphicsItemFlag> in_stack_ffffffffffffffa0;
  QFlagsStorage<QGraphicsItem::GraphicsItemFlag> in_stack_ffffffffffffffa4;
  QWidget *in_stack_ffffffffffffffa8;
  QRectF local_38;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QGraphicsProxyWidget *)0x9be71f);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9be735);
  if (bVar1) {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9be74c);
    bVar1 = QWidget::isVisible((QWidget *)0x9be754);
    if (bVar1) {
      local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsWidget::rect
                ((QGraphicsWidget *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      QRectF::operator&(&local_38,(QRectF *)(in_RDX + 0x40));
      local_18 = QRectF::toAlignedRect();
      bVar1 = QRect::isEmpty(in_stack_ffffffffffffff30);
      if (!bVar1) {
        plVar4 = (long *)QPainter::device();
        iVar2 = (**(code **)(*plVar4 + 0x10))();
        bVar1 = false;
        if (iVar2 != 1) {
          in_stack_ffffffffffffffa0.i =
               (Int)QGraphicsItem::flags((QGraphicsItem *)in_stack_ffffffffffffff30);
          in_stack_ffffffffffffffa4.i =
               (Int)QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                              ((QFlags<QGraphicsItem::GraphicsItemFlag> *)in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff2c);
          IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffa4);
          bVar1 = IVar3 != 0;
        }
        if (bVar1) {
          pQVar6 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9be868);
          pQVar5 = QWidget::geometry(pQVar6);
          QPainter::setClipRect(in_RSI,(ClipOperation)pQVar5);
        }
        pQVar6 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9be893);
        QVar7.i = (int)((ulong)pQVar6 >> 0x20);
        targetOffset = QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff2c,
                                                        in_stack_ffffffffffffff28));
        QRegion::QRegion((QRegion *)&stack0xffffffffffffff90,(QRect *)local_18,Rectangle);
        QFlag::QFlag(local_78,3);
        QFlags<QWidget::RenderFlag>::QFlagsStorageHelper
                  ((QFlags<QWidget::RenderFlag> *)
                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),QVar7);
        QWidget::render(in_stack_ffffffffffffffa8,
                        (QPainter *)
                        CONCAT44(in_stack_ffffffffffffffa4.i,in_stack_ffffffffffffffa0.i),
                        (QPoint *)targetOffset,(QRegion *)in_stack_ffffffffffffff90.d,d._4_4_);
        QRegion::~QRegion((QRegion *)&stack0xffffffffffffff90);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidget::paint(QPainter *painter, const QStyleOptionGraphicsItem *option, QWidget *widget)
{
    Q_D(QGraphicsProxyWidget);
    Q_UNUSED(widget);
    if (!d->widget || !d->widget->isVisible())
        return;

    // Filter out repaints on the window frame.
    const QRect exposedWidgetRect = (option->exposedRect & rect()).toAlignedRect();
    if (exposedWidgetRect.isEmpty())
        return;

    // When rendering to pdf etc. painting may go outside widget boundaries unless clipped
    if (painter->device()->devType() != QInternal::Widget && (flags() & ItemClipsChildrenToShape))
        painter->setClipRect(d->widget->geometry(), Qt::IntersectClip);

    d->widget->render(painter, exposedWidgetRect.topLeft(), exposedWidgetRect);
}